

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O2

int main(void)

{
  cothread_t cothread;
  ostream *poVar1;
  long *in_FS_OFFSET;
  info i;
  long local_20;
  undefined4 local_18;
  
  cothread = diy::coroutine::co_create(0x400000,f);
  local_20 = in_FS_OFFSET[-0x1d];
  if (local_20 == 0) {
    local_20 = *in_FS_OFFSET + -0xe0;
    in_FS_OFFSET[-0x1d] = local_20;
  }
  local_18 = 5;
  in_FS_OFFSET[-0x1e] = (long)&local_20;
  poVar1 = std::operator<<((ostream *)&std::cout,"Jumping to f()");
  std::endl<char,std::char_traits<char>>(poVar1);
  diy::coroutine::co_switch(cothread);
  poVar1 = std::operator<<((ostream *)&std::cout,"Back in main");
  std::endl<char,std::char_traits<char>>(poVar1);
  diy::coroutine::co_switch(cothread);
  diy::coroutine::co_delete(cothread);
  poVar1 = std::operator<<((ostream *)&std::cout,"Done");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    auto fc = dc::co_create(4*1024*1024, &f);

    info i;
    i.main = dc::co_active();
    i.arg  = 5;

    dc::argument() = &i;

    std::cout << "Jumping to f()" << std::endl;

    dc::co_switch(fc);
    std::cout << "Back in main" << std::endl;

    dc::co_switch(fc);
    dc::co_delete(fc);

    std::cout << "Done" << std::endl;
}